

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::adjustFieldTypes
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *pattern,PtnSkeleton *specifiedSkeleton,int32_t flags,
          UDateTimePatternMatchOptions options)

{
  uint field_00;
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  char *__filename;
  UChar local_12e;
  int32_t local_f4;
  UChar local_f0;
  int32_t j;
  UChar c;
  UBool skelFieldIsNumeric;
  UBool patFieldIsNumeric;
  int32_t skelFieldLen;
  int32_t adjFieldLen;
  int32_t reqFieldLen;
  UChar reqFieldChar;
  int32_t typeValue;
  dtTypeElem *row;
  int32_t canonicalIndex;
  UnicodeString quoteLiteral;
  UnicodeString field;
  int32_t i;
  UDateTimePatternMatchOptions options_local;
  int32_t flags_local;
  PtnSkeleton *specifiedSkeleton_local;
  UnicodeString *pattern_local;
  DateTimePatternGenerator *this_local;
  UnicodeString *newPattern;
  
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  FormatParser::set(this->fp,pattern);
  for (field.fUnion._48_4_ = 0; (int)field.fUnion._48_4_ < this->fp->itemNumber;
      field.fUnion._48_4_ = field.fUnion._48_4_ + 1) {
    icu_63::UnicodeString::UnicodeString
              ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30),
               (UnicodeString *)(&this->fp->field_0x8 + (long)(int)field.fUnion._48_4_ * 0x40));
    UVar2 = FormatParser::isQuoteLiteral((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
    if (UVar2 == '\0') {
      UVar2 = FormatParser::isPatternSeparator
                        (this->fp,(UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
      if (UVar2 == '\0') {
        iVar3 = FormatParser::getCanonicalIndex
                          ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
        if (iVar3 < 0) {
          icu_63::UnicodeString::operator+=
                    (__return_storage_ptr__,(UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
        }
        else {
          field_00 = *(uint *)(dtTypes + (long)iVar3 * 0x10 + 4);
          if (((flags & 1U) == 0) || (field_00 != 0xd)) {
            if ((this->dtMatcher->skeleton).type[(int)field_00] != 0) {
              local_12e = SkeletonFields::getFieldChar
                                    (&(this->dtMatcher->skeleton).original,field_00);
              __filename = (char *)(ulong)field_00;
              skelFieldLen = SkeletonFields::getFieldLength
                                       (&(this->dtMatcher->skeleton).original,field_00);
              if ((local_12e == L'E') && (skelFieldLen < 3)) {
                skelFieldLen = 3;
              }
              _c = skelFieldLen;
              if ((((field_00 == 0xb) &&
                   ((options & UDATPG_MATCH_HOUR_FIELD_LENGTH) == UDATPG_MATCH_NO_OPTIONS)) ||
                  ((field_00 == 0xc &&
                   ((options & UDATPG_MATCH_MINUTE_FIELD_LENGTH) == UDATPG_MATCH_NO_OPTIONS)))) ||
                 ((field_00 == 0xd &&
                  ((options & UDATPG_MATCH_SECOND_FIELD_LENGTH) == UDATPG_MATCH_NO_OPTIONS)))) {
                _c = icu_63::UnicodeString::length
                               ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
              }
              else if (specifiedSkeleton != (PtnSkeleton *)0x0) {
                __filename = (char *)(ulong)field_00;
                iVar4 = SkeletonFields::getFieldLength(&specifiedSkeleton->original,field_00);
                bVar1 = 0 < specifiedSkeleton->type[(int)field_00];
                if (((iVar4 == skelFieldLen) ||
                    ((0 < *(short *)(dtTypes + (long)iVar3 * 0x10 + 8) && (!bVar1)))) ||
                   ((bVar1 && (0 >= *(short *)(dtTypes + (long)iVar3 * 0x10 + 8))))) {
                  _c = icu_63::UnicodeString::length
                                 ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
                }
              }
              if ((((field_00 == 0xb) || (field_00 == 3)) || (field_00 == 6)) ||
                 ((field_00 == 1 && (local_12e != L'Y')))) {
                __filename = (char *)0x0;
                local_12e = icu_63::UnicodeString::charAt
                                      ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30),0);
              }
              local_f0 = local_12e;
              if ((field_00 == 0xb) && ((flags & 2U) != 0)) {
                local_f0 = this->fDefaultHourFormatChar;
              }
              icu_63::UnicodeString::remove
                        ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30),__filename);
              for (local_f4 = _c; 0 < local_f4; local_f4 = local_f4 + -1) {
                icu_63::UnicodeString::operator+=
                          ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30),local_f0);
              }
            }
          }
          else {
            icu_63::UnicodeString::operator+=
                      ((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30),&this->decimal);
            SkeletonFields::appendFieldTo
                      (&(this->dtMatcher->skeleton).original,0xe,
                       (UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
          }
          icu_63::UnicodeString::operator+=
                    (__return_storage_ptr__,(UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
        }
      }
      else {
        icu_63::UnicodeString::operator+=
                  (__return_storage_ptr__,(UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
      }
    }
    else {
      icu_63::UnicodeString::UnicodeString((UnicodeString *)&canonicalIndex);
      FormatParser::getQuoteLiteral
                (this->fp,(UnicodeString *)&canonicalIndex,
                 (int32_t *)(field.fUnion.fStackFields.fBuffer + 0x17));
      icu_63::UnicodeString::operator+=(__return_storage_ptr__,(UnicodeString *)&canonicalIndex);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)&canonicalIndex);
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&quoteLiteral.fUnion + 0x30));
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::adjustFieldTypes(const UnicodeString& pattern,
                                           const PtnSkeleton* specifiedSkeleton,
                                           int32_t flags,
                                           UDateTimePatternMatchOptions options) {
    UnicodeString newPattern;
    fp->set(pattern);
    for (int32_t i=0; i < fp->itemNumber; i++) {
        UnicodeString field = fp->items[i];
        if ( fp->isQuoteLiteral(field) ) {

            UnicodeString quoteLiteral;
            fp->getQuoteLiteral(quoteLiteral, &i);
            newPattern += quoteLiteral;
        }
        else {
            if (fp->isPatternSeparator(field)) {
                newPattern+=field;
                continue;
            }
            int32_t canonicalIndex = fp->getCanonicalIndex(field);
            if (canonicalIndex < 0) {
                newPattern+=field;
                continue;  // don't adjust
            }
            const dtTypeElem *row = &dtTypes[canonicalIndex];
            int32_t typeValue = row->field;

            // handle day periods - with #13183, no longer need special handling here, integrated with normal types

            if ((flags & kDTPGFixFractionalSeconds) != 0 && typeValue == UDATPG_SECOND_FIELD) {
                field += decimal;
                dtMatcher->skeleton.original.appendFieldTo(UDATPG_FRACTIONAL_SECOND_FIELD, field);
            } else if (dtMatcher->skeleton.type[typeValue]!=0) {
                    // Here:
                    // - "reqField" is the field from the originally requested skeleton, with length
                    // "reqFieldLen".
                    // - "field" is the field from the found pattern.
                    //
                    // The adjusted field should consist of characters from the originally requested
                    // skeleton, except in the case of UDATPG_HOUR_FIELD or UDATPG_MONTH_FIELD or
                    // UDATPG_WEEKDAY_FIELD or UDATPG_YEAR_FIELD, in which case it should consist
                    // of characters from the  found pattern.
                    //
                    // The length of the adjusted field (adjFieldLen) should match that in the originally
                    // requested skeleton, except that in the following cases the length of the adjusted field
                    // should match that in the found pattern (i.e. the length of this pattern field should
                    // not be adjusted):
                    // 1. typeValue is UDATPG_HOUR_FIELD/MINUTE/SECOND and the corresponding bit in options is
                    //    not set (ticket #7180). Note, we may want to implement a similar change for other
                    //    numeric fields (MM, dd, etc.) so the default behavior is to get locale preference for
                    //    field length, but options bits can be used to override this.
                    // 2. There is a specified skeleton for the found pattern and one of the following is true:
                    //    a) The length of the field in the skeleton (skelFieldLen) is equal to reqFieldLen.
                    //    b) The pattern field is numeric and the skeleton field is not, or vice versa.

                    UChar reqFieldChar = dtMatcher->skeleton.original.getFieldChar(typeValue);
                    int32_t reqFieldLen = dtMatcher->skeleton.original.getFieldLength(typeValue);
                    if (reqFieldChar == CAP_E && reqFieldLen < 3)
                        reqFieldLen = 3; // 1-3 for E are equivalent to 3 for c,e
                    int32_t adjFieldLen = reqFieldLen;
                    if ( (typeValue==UDATPG_HOUR_FIELD && (options & UDATPG_MATCH_HOUR_FIELD_LENGTH)==0) ||
                         (typeValue==UDATPG_MINUTE_FIELD && (options & UDATPG_MATCH_MINUTE_FIELD_LENGTH)==0) ||
                         (typeValue==UDATPG_SECOND_FIELD && (options & UDATPG_MATCH_SECOND_FIELD_LENGTH)==0) ) {
                         adjFieldLen = field.length();
                    } else if (specifiedSkeleton) {
                        int32_t skelFieldLen = specifiedSkeleton->original.getFieldLength(typeValue);
                        UBool patFieldIsNumeric = (row->type > 0);
                        UBool skelFieldIsNumeric = (specifiedSkeleton->type[typeValue] > 0);
                        if (skelFieldLen == reqFieldLen || (patFieldIsNumeric && !skelFieldIsNumeric) || (skelFieldIsNumeric && !patFieldIsNumeric)) {
                            // don't adjust the field length in the found pattern
                            adjFieldLen = field.length();
                        }
                    }
                    UChar c = (typeValue!= UDATPG_HOUR_FIELD
                            && typeValue!= UDATPG_MONTH_FIELD
                            && typeValue!= UDATPG_WEEKDAY_FIELD
                            && (typeValue!= UDATPG_YEAR_FIELD || reqFieldChar==CAP_Y))
                            ? reqFieldChar
                            : field.charAt(0);
                    if (typeValue == UDATPG_HOUR_FIELD && (flags & kDTPGSkeletonUsesCapJ) != 0) {
                        c = fDefaultHourFormatChar;
                    }
                    field.remove();
                    for (int32_t j=adjFieldLen; j>0; --j) {
                        field += c;
                    }
            }
            newPattern+=field;
        }
    }
    return newPattern;
}